

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O2

VkSurfaceKHR
create_surface_glfw(VkInstance instance,GLFWwindow *window,VkAllocationCallbacks *allocator)

{
  VkResult VVar1;
  int iVar2;
  ostream *poVar3;
  char *error_msg;
  char *local_10;
  VkSurfaceKHR local_8;
  
  local_8 = (VkSurfaceKHR)0x0;
  VVar1 = glfwCreateWindowSurface(instance,window,allocator,(VkSurfaceKHR_conflict *)&local_8);
  if (VVar1 != VK_SUCCESS) {
    iVar2 = glfwGetError(&local_10);
    if (iVar2 != 0) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::operator<<(poVar3," ");
      if (local_10 != (char *)0x0) {
        std::operator<<((ostream *)&std::cout,local_10);
      }
      std::operator<<((ostream *)&std::cout,"\n");
    }
    local_8 = (VkSurfaceKHR)0x0;
  }
  return local_8;
}

Assistant:

VkSurfaceKHR create_surface_glfw(VkInstance instance, GLFWwindow* window, VkAllocationCallbacks* allocator = nullptr) {
    VkSurfaceKHR surface = VK_NULL_HANDLE;
    VkResult err = glfwCreateWindowSurface(instance, window, allocator, &surface);
    if (err) {
        const char* error_msg;
        int ret = glfwGetError(&error_msg);
        if (ret != 0) {
            std::cout << ret << " ";
            if (error_msg != nullptr) std::cout << error_msg;
            std::cout << "\n";
        }
        surface = VK_NULL_HANDLE;
    }
    return surface;
}